

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O3

uint32_t predict_sup_adf(warm_cb *data,multi_learner *base,example *ec)

{
  uint32_t uVar1;
  ulong uVar2;
  uint32_t i;
  ulong uVar3;
  float fVar4;
  vector<float,_std::allocator<float>_> local_40;
  
  std::vector<float,_std::allocator<float>_>::vector(&local_40,&data->cumulative_costs);
  if ((long)local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    i = 0;
    uVar1 = 0;
    if (local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) goto LAB_001e994d;
  }
  else {
    fVar4 = 3.4028235e+38;
    uVar2 = 0;
    uVar3 = 0;
    do {
      if (local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[uVar2] < fVar4) {
        uVar3 = uVar2 & 0xffffffff;
        fVar4 = local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[uVar2];
      }
      uVar2 = uVar2 + 1;
      uVar1 = (uint32_t)uVar3;
    } while ((uVar2 & 0xffffffff) <
             (ulong)((long)local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2));
  }
  i = uVar1;
  operator_delete(local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start);
LAB_001e994d:
  uVar1 = predict_sublearner_adf(data,base,ec,i);
  return uVar1;
}

Assistant:

uint32_t predict_sup_adf(warm_cb& data, multi_learner& base, example& ec)
{
	uint32_t argmin = find_min(data.cumulative_costs);
	return predict_sublearner_adf(data, base, ec, argmin);
}